

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O2

void __thiscall HEkkDualRHS::createArrayOfPrimalInfeasibilities(HEkkDualRHS *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  HEkk *pHVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  pHVar5 = this->ekk_instance_;
  pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (pHVar5->lp_).num_row_;
  pdVar7 = (pHVar5->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pHVar5->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (pHVar5->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = (pHVar5->options_->super_HighsOptionsStruct).primal_feasibility_tolerance;
  uVar11 = 0;
  uVar10 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    dVar2 = pdVar7[uVar11];
    dVar12 = pdVar8[uVar11];
    if (dVar12 - dVar1 <= dVar2) {
      dVar3 = pdVar9[uVar11];
      dVar12 = 0.0;
      if (dVar1 + dVar3 < dVar2) {
        dVar12 = dVar2 - dVar3;
      }
    }
    else {
      dVar12 = dVar12 - dVar2;
    }
    if ((pHVar5->info_).store_squared_primal_infeasibility == false) {
      dVar12 = ABS(dVar12);
    }
    else {
      dVar12 = dVar12 * dVar12;
    }
    pdVar6[uVar11] = dVar12;
  }
  return;
}

Assistant:

void HEkkDualRHS::createArrayOfPrimalInfeasibilities() {
  HighsInt numRow = ekk_instance_.lp_.num_row_;
  const double* baseValue = ekk_instance_.info_.baseValue_.data();
  const double* baseLower = ekk_instance_.info_.baseLower_.data();
  const double* baseUpper = ekk_instance_.info_.baseUpper_.data();
  const double Tp = ekk_instance_.options_->primal_feasibility_tolerance;
  for (HighsInt i = 0; i < numRow; i++) {
    // @primal_infeasibility calculation
    const double value = baseValue[i];
    const double lower = baseLower[i];
    const double upper = baseUpper[i];
    double primal_infeasibility = 0;
    if (value < lower - Tp) {
      primal_infeasibility = lower - value;
    } else if (value > upper + Tp) {
      primal_infeasibility = value - upper;
    }
    if (ekk_instance_.info_.store_squared_primal_infeasibility)
      work_infeasibility[i] = primal_infeasibility * primal_infeasibility;
    else
      work_infeasibility[i] = fabs(primal_infeasibility);
  }
}